

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

int SoapySDRDevice_deactivateStream
              (SoapySDRDevice *device,SoapySDRStream *stream,int flags,longlong timeNs)

{
  int iVar1;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 0x400) = 0;
  iVar1 = (**(code **)(*(long *)device + 0x88))(device,stream,flags,timeNs);
  return iVar1;
}

Assistant:

int SoapySDRDevice_deactivateStream(SoapySDRDevice *device,
    SoapySDRStream *stream,
    const int flags,
    const long long timeNs)
{
    __SOAPY_SDR_C_TRY
    return device->deactivateStream(reinterpret_cast<SoapySDR::Stream *>(stream), flags, timeNs);
    __SOAPY_SDR_C_CATCH_RET(SOAPY_SDR_STREAM_ERROR);
}